

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stmt.cc
# Opt level: O0

void __thiscall
kratos::CommentStmt::CommentStmt(CommentStmt *this,string *comment,uint32_t line_width)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_50;
  ulong local_28;
  size_type pos;
  string *psStack_18;
  uint32_t line_width_local;
  string *comment_local;
  CommentStmt *this_local;
  
  pos._4_4_ = line_width;
  psStack_18 = comment;
  comment_local = (string *)this;
  Stmt::Stmt(&this->super_Stmt,Comment);
  (this->super_Stmt).super_IRNode._vptr_IRNode = (_func_int **)&PTR_accept_005c87c0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->comments_);
  local_28 = 0;
  while( true ) {
    local_28 = std::__cxx11::string::find((char)comment,10);
    if (local_28 == 0xffffffffffffffff) break;
    std::__cxx11::string::erase((ulong)comment,local_28);
  }
  line_wrap(&local_50,comment,pos._4_4_);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&this->comments_,&local_50);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_50);
  return;
}

Assistant:

CommentStmt::CommentStmt(std::string comment, uint32_t line_width) : Stmt(StatementType::Comment) {
    // erase the new line
    std::string::size_type pos = 0;
    while ((pos = comment.find('\n', pos)) != std::string::npos) {
        comment.erase(pos, 1);
    }
    comments_ = line_wrap(comment, line_width);
}